

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonMonteCarloPricer.cpp
# Opt level: O2

double __thiscall
VarianceSwapsHestonMonteCarloPricer::pathPrice
          (VarianceSwapsHestonMonteCarloPricer *this,vector<double,_std::allocator<double>_> *path,
          double maturity)

{
  pointer pdVar1;
  long lVar2;
  double dVar3;
  
  pdVar1 = (path->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = 0.0;
  for (lVar2 = 1;
      (long)(path->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != lVar2; lVar2 = lVar2 + 1) {
    dVar3 = dVar3 + (pdVar1[lVar2] - pdVar1[lVar2 + -1]) * (pdVar1[lVar2] - pdVar1[lVar2 + -1]);
  }
  return (dVar3 * 10000.0) / maturity;
}

Assistant:

double VarianceSwapsHestonMonteCarloPricer::pathPrice(std::vector<double> path,
                                                double maturity) const
{
    double pathPrice = 0.0; 
    for(size_t i = 0; i < path.size()-1; i++)
    {   
        pathPrice += std::pow(path[i+1]-path[i],2); //Reminder : path[i] = log(S_ti) 
    }
    return 100*100*pathPrice/maturity;
}